

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O0

void __thiscall
icu_63::Calendar::validateField(Calendar *this,UCalendarDateFields field,UErrorCode *status)

{
  uint uVar1;
  uint uVar2;
  int32_t iVar3;
  int iVar4;
  int iVar5;
  int32_t y;
  UErrorCode *status_local;
  UCalendarDateFields field_local;
  Calendar *this_local;
  
  if (field == UCAL_DATE) {
    uVar2 = (*(this->super_UObject)._vptr_UObject[0x24])();
    uVar1 = internalGet(this,UCAL_MONTH);
    iVar4 = (*(this->super_UObject)._vptr_UObject[0x22])(this,(ulong)uVar2,(ulong)uVar1);
    validateField(this,UCAL_DATE,1,iVar4,status);
  }
  else if (field == UCAL_DAY_OF_YEAR) {
    uVar2 = (*(this->super_UObject)._vptr_UObject[0x24])();
    iVar4 = (*(this->super_UObject)._vptr_UObject[0x23])(this,(ulong)uVar2);
    validateField(this,UCAL_DAY_OF_YEAR,1,iVar4,status);
  }
  else if (field == UCAL_DAY_OF_WEEK_IN_MONTH) {
    iVar3 = internalGet(this,UCAL_DAY_OF_WEEK_IN_MONTH);
    if (iVar3 == 0) {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      iVar4 = (*(this->super_UObject)._vptr_UObject[0xe])(this,8);
      iVar5 = (*(this->super_UObject)._vptr_UObject[0x10])(this,8);
      validateField(this,UCAL_DAY_OF_WEEK_IN_MONTH,iVar4,iVar5,status);
    }
  }
  else {
    iVar4 = (*(this->super_UObject)._vptr_UObject[0xe])(this,(ulong)field);
    iVar5 = (*(this->super_UObject)._vptr_UObject[0x10])(this,(ulong)field);
    validateField(this,field,iVar4,iVar5,status);
  }
  return;
}

Assistant:

void Calendar::validateField(UCalendarDateFields field, UErrorCode &status) {
    int32_t y;
    switch (field) {
    case UCAL_DAY_OF_MONTH:
        y = handleGetExtendedYear();
        validateField(field, 1, handleGetMonthLength(y, internalGet(UCAL_MONTH)), status);
        break;
    case UCAL_DAY_OF_YEAR:
        y = handleGetExtendedYear();
        validateField(field, 1, handleGetYearLength(y), status);
        break;
    case UCAL_DAY_OF_WEEK_IN_MONTH:
        if (internalGet(field) == 0) {
#if defined (U_DEBUG_CAL)
            fprintf(stderr, "%s:%d: ILLEGAL ARG because DOW in month cannot be 0\n",
                __FILE__, __LINE__);
#endif
            status = U_ILLEGAL_ARGUMENT_ERROR; // "DAY_OF_WEEK_IN_MONTH cannot be zero"
            return;
        }
        validateField(field, getMinimum(field), getMaximum(field), status);
        break;
    default:
        validateField(field, getMinimum(field), getMaximum(field), status);
        break;
    }
}